

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O1

void __thiscall
QVariant::setValue<QIBusAttribute_const&,void>(QVariant *this,QIBusAttribute *avalue)

{
  undefined1 *puVar1;
  ulong uVar2;
  quint32 qVar3;
  quint32 qVar4;
  quint32 qVar5;
  bool bVar6;
  PrivateShared *pPVar7;
  long in_FS_OFFSET;
  QMetaType local_48;
  anon_union_24_3_e3d07ef4_for_data local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIBusAttribute>::metaType;
  uVar2 = *(ulong *)&(this->d).field_0x18;
  if (((uVar2 & 1) == 0) || (*(int *)(this->d).data.shared == 1)) {
    local_40.shared = (PrivateShared *)(uVar2 & 0xfffffffffffffffc);
    bVar6 = comparesEqual((QMetaType *)&local_40.shared,&local_48);
    if (bVar6) {
      pPVar7 = (PrivateShared *)this;
      if (((this->d).field_0x18 & 1) != 0) {
        pPVar7 = (this->d).data.shared;
        pPVar7 = pPVar7 + *(int *)(pPVar7 + 4);
      }
      QString::operator=((QString *)pPVar7,(QString *)avalue);
      QHash<QString,_QDBusArgument>::operator=
                ((QHash<QString,_QDBusArgument> *)(pPVar7 + 0x18),
                 &(avalue->super_QIBusSerializable).attachments);
      qVar3 = avalue->value;
      qVar4 = avalue->start;
      qVar5 = avalue->end;
      *(Type *)&((Private *)&pPVar7[0x20].field_0x0)->data = avalue->type;
      *(quint32 *)&pPVar7[0x24].field_0x0 = qVar3;
      *(quint32 *)&pPVar7[0x28].field_0x0 = qVar4;
      *(quint32 *)&pPVar7[0x2c].field_0x0 = qVar5;
      puVar1 = &(this->d).field_0x18;
      *puVar1 = *puVar1 & 0xfd;
      goto LAB_0011c68d;
    }
  }
  QVariant::QVariant((QVariant *)&local_40,(QMetaType)0x12a548,avalue);
  operator=(this,(QVariant *)&local_40);
  QVariant::~QVariant((QVariant *)&local_40);
LAB_0011c68d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setValue(T &&avalue)
    {
        using VT = std::decay_t<T>;
        QMetaType metaType = QMetaType::fromType<VT>();
        // If possible we reuse the current QVariant private.
        if (isDetached() && d.type() == metaType) {
            *reinterpret_cast<VT *>(const_cast<void *>(constData())) = std::forward<T>(avalue);
            d.is_null = false;
        } else {
            *this = QVariant::fromValue<VT>(std::forward<T>(avalue));
        }
    }